

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocParseBuffer(TidyDocImpl *doc,TidyBuffer *inbuf)

{
  StreamIn *in_00;
  StreamIn *in;
  int status;
  TidyBuffer *inbuf_local;
  TidyDocImpl *doc_local;
  
  in._4_4_ = -0x16;
  if (inbuf != (TidyBuffer *)0x0) {
    in_00 = prvTidyBufferInput(doc,inbuf,(int)(doc->config).value[0x22].v);
    in._4_4_ = prvTidyDocParseStream(doc,in_00);
    prvTidyfreeStreamIn(in_00);
  }
  return in._4_4_;
}

Assistant:

int   tidyDocParseBuffer( TidyDocImpl* doc, TidyBuffer* inbuf )
{
    int status = -EINVAL;
    if ( inbuf )
    {
        StreamIn* in = TY_(BufferInput)( doc, inbuf, cfg( doc, TidyInCharEncoding ));
        status = TY_(DocParseStream)( doc, in );
        TY_(freeStreamIn)(in);
    }
    return status;
}